

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

double __thiscall HPresolve::getColumnDualPost(HPresolve *this,int col)

{
  reference pvVar1;
  reference pvVar2;
  int cnt;
  double sum;
  double z;
  int row;
  size_type in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  undefined4 local_24;
  undefined8 local_20;
  
  local_20 = 0.0;
  pvVar1 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb0,
                      in_stack_ffffffffffffffa8);
  local_24 = *pvVar1;
  while( true ) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
    if (*pvVar1 <= local_24) break;
    std::vector<int,_std::allocator<int>_>::at
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8);
    pvVar1 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
    if (*pvVar1 != 0) {
      std::vector<int,_std::allocator<int>_>::at
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
      pvVar2 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffb0 = (vector<double,_std::allocator<double>_> *)*pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      local_20 = (double)in_stack_ffffffffffffffb0 * *pvVar2 + local_20;
    }
    local_24 = local_24 + 1;
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::at
                     (in_stack_ffffffffffffffb0,(size_type)local_20);
  return local_20 + *pvVar2;
}

Assistant:

double HPresolve::getColumnDualPost(int col) {
	int row;
	double z;
	double sum = 0;
	for (int cnt=Astart.at(col); cnt<Aend.at(col); cnt++)
		if (flagRow.at(Aindex.at(cnt))) {
			row = Aindex.at(cnt);
			sum = sum + valueRowDual.at(row)*Avalue.at(cnt);
		}
	z = sum + colCostAtEl.at(col) ;
	return z;
}